

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

IdentifierSelectNameSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IdentifierSelectNameSyntax,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::ElementSelectSyntax>&>
          (BumpAllocator *this,Token *args,SyntaxList<slang::syntax::ElementSelectSyntax> *args_1)

{
  Token identifier;
  IdentifierSelectNameSyntax *this_00;
  
  this_00 = (IdentifierSelectNameSyntax *)allocate(this,0x60,8);
  identifier.kind = args->kind;
  identifier._2_1_ = args->field_0x2;
  identifier.numFlags.raw = (args->numFlags).raw;
  identifier.rawLen = args->rawLen;
  identifier.info = args->info;
  slang::syntax::IdentifierSelectNameSyntax::IdentifierSelectNameSyntax(this_00,identifier,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }